

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall am_CList::Add_Update(am_CList *this,CItem *item)

{
  CItem *pCVar1;
  CItem *pCVar2;
  anon_union_8_2_a7014589_for_CItem_2 *paVar3;
  CItem *pCVar4;
  
  if (item != (CItem *)0x0) {
    if (this->head != (CItem *)0x0) {
      pCVar1 = this->head;
      pCVar4 = (CItem *)0x0;
      do {
        pCVar2 = pCVar1;
        if (pCVar2 == item) {
          paVar3 = &pCVar4->field_1;
          if (pCVar4 == (CItem *)0x0) {
            paVar3 = (anon_union_8_2_a7014589_for_CItem_2 *)this;
          }
          *paVar3 = pCVar2->field_1;
        }
        pCVar1 = (pCVar2->field_1).prev;
        pCVar4 = pCVar2;
      } while ((pCVar2->field_1).prev != (CItem *)0x0);
    }
    if (this->head == (CItem *)0x0) {
      (item->field_1).prev = (CItem *)0x0;
    }
    else {
      item->field_1 = this->head->field_1;
      this = (am_CList *)&this->head->field_1;
    }
    *this = (am_CList)item;
  }
  return;
}

Assistant:

void
am_CList::Add_Update(CItem *item)
{
  if (item) {
    Remove_Inv(item);
    if (head) {
      item->next_invalid = head->next_invalid;
      head->next_invalid = item;
    } else {
      item->next_invalid = head;
      head = item;
    }
  }
}